

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O3

void __thiscall Pl_RunLength::decode(Pl_RunLength *this,uchar *data,size_t len)

{
  uint *puVar1;
  state_e sVar2;
  uint uVar3;
  runtime_error *this_00;
  Members *pMVar4;
  size_t sVar5;
  
  pMVar4 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
           .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
  if (((anonymous_namespace)::memory_limit != 0) &&
     ((anonymous_namespace)::memory_limit < (pMVar4->out)._M_string_length + len)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Pl_RunLength memory limit exceeded");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::reserve((ulong)&pMVar4->out);
  if (len != 0) {
    pMVar4 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
    sVar5 = 0;
    do {
      sVar2 = pMVar4->state;
      if (sVar2 == st_run) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&pMVar4->out,(pMVar4->out)._M_string_length,0,(char)pMVar4->length);
        pMVar4 = (this->m)._M_t.
                 super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                 .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
LAB_00137c9a:
        pMVar4->state = st_top;
      }
      else if (sVar2 == st_copying) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&pMVar4->out,(pMVar4->out)._M_string_length,0,'\x01');
        pMVar4 = (this->m)._M_t.
                 super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                 .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
        puVar1 = &pMVar4->length;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) goto LAB_00137c9a;
      }
      else if (sVar2 == st_top) {
        uVar3 = (uint)data[sVar5];
        if ((char)data[sVar5] < '\0') {
          if (uVar3 != 0x80) {
            pMVar4->length = 0x101 - uVar3;
            pMVar4->state = st_run;
          }
        }
        else {
          pMVar4->length = uVar3 + 1;
          pMVar4->state = st_copying;
        }
      }
      sVar5 = sVar5 + 1;
    } while (len != sVar5);
  }
  return;
}

Assistant:

void
Pl_RunLength::decode(unsigned char const* data, size_t len)
{
    if (memory_limit && (len + m->out.size()) > memory_limit) {
        throw std::runtime_error("Pl_RunLength memory limit exceeded");
    }
    m->out.reserve(len);
    for (size_t i = 0; i < len; ++i) {
        unsigned char const& ch = data[i];
        switch (m->state) {
        case st_top:
            if (ch < 128) {
                // length represents remaining number of bytes to copy
                m->length = 1U + ch;
                m->state = st_copying;
            } else if (ch > 128) {
                // length represents number of copies of next byte
                m->length = 257U - ch;
                m->state = st_run;
            } else // ch == 128
            {
                // EOD; stay in this state
            }
            break;

        case st_copying:
            m->out.append(1, static_cast<char>(ch));
            if (--m->length == 0) {
                m->state = st_top;
            }
            break;

        case st_run:
            m->out.append(m->length, static_cast<char>(ch));
            m->state = st_top;
            break;
        }
    }
}